

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall
QTableModel::moveRows
          (QTableModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  QModelIndex *in_RDI;
  undefined8 in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  int fromRow;
  int destinationIndex;
  int fromIndex;
  int numItems;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_50;
  int local_40;
  bool local_21;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < in_EDX) {
    iVar2 = in_EDX + in_ECX + -1;
    iVar3 = (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,in_RSI);
    if (((((iVar2 < iVar3) && (-1 < in_R9D)) &&
         (iVar3 = in_R9D, iVar4 = (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,in_R8),
         iVar3 <= iVar4)) && ((in_EDX != in_R9D && (in_EDX != in_R9D + -1)))) &&
       ((0 < in_ECX &&
        ((bVar1 = QModelIndex::isValid((QModelIndex *)CONCAT44(iVar2,iVar3)), !bVar1 &&
         (bVar1 = QModelIndex::isValid((QModelIndex *)CONCAT44(iVar2,iVar3)), !bVar1)))))) {
      uVar5 = QAbstractItemModel::beginMoveRows
                        (in_RDI,(int)in_RSI,in_EDX,(QModelIndex *)(ulong)((in_EDX + in_ECX) - 1),
                         (int)in_R8);
      if ((uVar5 & 1) == 0) {
        local_21 = false;
      }
      else {
        iVar4 = in_ECX;
        QModelIndex::QModelIndex((QModelIndex *)0x8d4789);
        local_50 = (**(code **)(*(long *)in_RDI + 0x80))(in_RDI,local_20);
        local_50 = iVar4 * local_50;
        tableIndex((QTableModel *)CONCAT44(iVar2,iVar3),iVar4,in_stack_ffffffffffffff88);
        tableIndex((QTableModel *)CONCAT44(iVar2,iVar3),iVar4,in_stack_ffffffffffffff88);
        while (local_50 != 0) {
          QList<QTableWidgetItem_*>::move
                    ((QList<QTableWidgetItem_*> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),(qsizetype)in_RDI
                     ,CONCAT44(iVar2,iVar3));
          local_50 = local_50 + -1;
        }
        local_40 = in_ECX;
        if (in_R9D < in_EDX) {
          in_EDX = in_ECX + -1 + in_EDX;
        }
        while (local_40 != 0) {
          QList<QTableWidgetItem_*>::move
                    ((QList<QTableWidgetItem_*> *)CONCAT44(in_EDX,in_stack_ffffffffffffffa0),
                     (qsizetype)in_RDI,CONCAT44(iVar2,iVar3));
          local_40 = local_40 + -1;
        }
        QAbstractItemModel::endMoveRows();
        local_21 = true;
      }
      goto LAB_008d4890;
    }
  }
  local_21 = false;
LAB_008d4890:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QTableModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    if (sourceRow < 0
        || sourceRow + count - 1 >= rowCount(sourceParent)
        || destinationChild < 0
        || destinationChild > rowCount(destinationParent)
        || sourceRow == destinationChild
        || sourceRow == destinationChild - 1
        || count <= 0
        || sourceParent.isValid()
        || destinationParent.isValid()) {
        return false;
    }
    if (!beginMoveRows(sourceParent, sourceRow, sourceRow + count - 1, destinationParent, destinationChild))
        return false;

    // Table items
    int numItems = count * columnCount();
    int fromIndex = tableIndex(sourceRow, 0);
    int destinationIndex = tableIndex(destinationChild, 0);
    if (destinationChild < sourceRow)
        fromIndex += numItems - 1;
    else
        destinationIndex--;
    while (numItems--)
        tableItems.move(fromIndex, destinationIndex);

    // Header items
    int fromRow = sourceRow;
    if (destinationChild < sourceRow)
        fromRow += count - 1;
    else
        destinationChild--;
    while (count--)
        verticalHeaderItems.move(fromRow, destinationChild);

    endMoveRows();
    return true;
}